

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

bool __thiscall QAbstractSpinBox::event(QAbstractSpinBox *this,QEvent *event)

{
  ushort uVar1;
  QAbstractSpinBoxPrivate *this_00;
  char cVar2;
  bool bVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  double dVar5;
  double extraout_XMM1_Qa;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 0x61) {
    if (0x52 < uVar1) {
      if (uVar1 == 0x53) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          uVar4 = (**(code **)(*(long *)&this_00->edit->super_QWidget + 0x28))(this_00->edit,event);
          return (bool)uVar4;
        }
        goto LAB_00478f01;
      }
      if (uVar1 == 0x5a) goto LAB_00478ea4;
      goto LAB_00478eb0;
    }
    if (uVar1 == 0x25) {
LAB_00478ea4:
      (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0x100))(this_00);
      goto LAB_00478eb0;
    }
    if (uVar1 != 0x33) goto LAB_00478eb0;
    cVar2 = (**(code **)(*(long *)&this_00->edit->super_QWidget + 0x28))(this_00->edit,event);
    bVar3 = true;
    if (cVar2 == '\0') goto LAB_00478eb0;
  }
  else {
    if (uVar1 - 0x7f < 3) {
      dVar5 = (double)QEventPoint::position();
      dVar5 = (double)(((ulong)dVar5 >> 0x20 & 0x80000000) << 0x20 | 0x3fe0000000000000) + dVar5;
      bVar3 = 2147483647.0 < dVar5;
      if (dVar5 <= -2147483648.0) {
        dVar5 = -2147483648.0;
      }
      local_28.xp.m_i =
           (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar5);
      dVar5 = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
              extraout_XMM1_Qa;
      bVar3 = 2147483647.0 < dVar5;
      if (dVar5 <= -2147483648.0) {
        dVar5 = -2147483648.0;
      }
      local_28.yp.m_i =
           (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar5);
      QAbstractSpinBoxPrivate::updateHoverControl(this_00,&local_28);
    }
    else if ((uVar1 == 100) || (uVar1 == 0x61)) {
      (this_00->cachedSizeHint).wd.m_i = -1;
      (this_00->cachedSizeHint).ht.m_i = -1;
      (this_00->cachedMinimumSizeHint).wd.m_i = -1;
      (this_00->cachedMinimumSizeHint).ht.m_i = -1;
    }
LAB_00478eb0:
    bVar3 = QWidget::event((QWidget *)this,event);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
LAB_00478f01:
  __stack_chk_fail();
}

Assistant:

bool QAbstractSpinBox::event(QEvent *event)
{
    Q_D(QAbstractSpinBox);
    switch (event->type()) {
    case QEvent::FontChange:
    case QEvent::StyleChange:
        d->cachedSizeHint = d->cachedMinimumSizeHint = QSize();
        break;
    case QEvent::ApplicationLayoutDirectionChange:
    case QEvent::LayoutDirectionChange:
        d->updateEditFieldGeometry();
        break;
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        d->updateHoverControl(static_cast<const QHoverEvent *>(event)->position().toPoint());
        break;
    case QEvent::ShortcutOverride:
        if (d->edit->event(event))
            return true;
        break;
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
    case QEvent::LeaveEditFocus:
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            const bool b = d->edit->event(event);
            d->edit->setSelection(d->edit->displayText().size() - d->suffix.size(),0);
            if (event->type() == QEvent::LeaveEditFocus)
                emit editingFinished();
            if (b)
                return true;
        }
        break;
#endif
    case QEvent::InputMethod:
        return d->edit->event(event);
    default:
        break;
    }
    return QWidget::event(event);
}